

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall sznet::Timer::restart(Timer *this,Timestamp now)

{
  Timestamp TVar1;
  Timer *this_local;
  Timestamp now_local;
  
  if ((this->m_repeat & 1U) == 0) {
    TVar1 = Timestamp::invalid();
    (this->m_expiration).m_microSecondsSinceEpoch = TVar1.m_microSecondsSinceEpoch;
  }
  else {
    TVar1 = addTime(now,this->m_interval);
    (this->m_expiration).m_microSecondsSinceEpoch = TVar1.m_microSecondsSinceEpoch;
  }
  return;
}

Assistant:

void Timer::restart(Timestamp now)
{
	if (m_repeat)
	{
		// 可以重复，下一次到期时间
		m_expiration = addTime(now, m_interval);
	}
	else
	{
		// 不可以重复，无效的时间戳对象
		m_expiration = Timestamp::invalid();
	}
}